

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

FILE * Minisat::open_to_read_file(char *path)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *pFVar5;
  FILE *pFVar6;
  int *piVar7;
  stat sStack_a8;
  
  sVar4 = strlen(path);
  if (((((3 < sVar4) && (iVar2 = strcmp(path + (sVar4 - 4),".bz2"), path != (char *)0x0)) &&
       (iVar2 == 0)) &&
      ((iVar2 = stat(path,&sStack_a8), iVar2 == 0 && (iVar2 = access(path,4), iVar2 == 0)))) &&
     (pFVar6 = fopen(path,"r"), pFVar6 != (FILE *)0x0)) {
    piVar7 = &bz2sig;
    do {
      if (*piVar7 == -1) {
        fclose(pFVar6);
        pFVar5 = open_pipe("bzip2 -c -d %s",path,"r");
        if (pFVar5 != (FILE *)0x0) {
          return pFVar5;
        }
        goto LAB_00106d8d;
      }
      iVar3 = getc(pFVar6);
      iVar2 = *piVar7;
      piVar7 = piVar7 + 1;
    } while (iVar3 == iVar2);
    fclose(pFVar6);
  }
LAB_00106d8d:
  sVar4 = strlen(path);
  if (((2 < sVar4) && (iVar2 = strcmp(path + (sVar4 - 3),".gz"), path != (char *)0x0)) &&
     ((iVar2 == 0 &&
      (((iVar2 = stat(path,&sStack_a8), iVar2 == 0 && (iVar2 = access(path,4), iVar2 == 0)) &&
       (pFVar6 = fopen(path,"r"), pFVar6 != (FILE *)0x0)))))) {
    piVar7 = &gzsig;
    do {
      if (*piVar7 == -1) {
        fclose(pFVar6);
        pFVar5 = open_pipe("gzip -c -d %s",path,"r");
        if (pFVar5 != (FILE *)0x0) {
          return pFVar5;
        }
        goto LAB_00106ddc;
      }
      iVar3 = getc(pFVar6);
      iVar2 = *piVar7;
      piVar7 = piVar7 + 1;
    } while (iVar3 == iVar2);
    fclose(pFVar6);
  }
LAB_00106ddc:
  sVar4 = strlen(path);
  if (((4 < sVar4) && (iVar2 = strcmp(path + (sVar4 - 5),".lzma"), path != (char *)0x0)) &&
     (((iVar2 == 0 &&
       ((iVar2 = stat(path,&sStack_a8), iVar2 == 0 && (iVar2 = access(path,4), iVar2 == 0)))) &&
      (pFVar6 = fopen(path,"r"), pFVar6 != (FILE *)0x0)))) {
    piVar7 = &lzmasig;
    do {
      if (*piVar7 == -1) {
        fclose(pFVar6);
        pFVar5 = open_pipe("lzma -c -d %s",path,"r");
        if (pFVar5 != (FILE *)0x0) {
          return pFVar5;
        }
        goto LAB_00106e2b;
      }
      iVar3 = getc(pFVar6);
      iVar2 = *piVar7;
      piVar7 = piVar7 + 1;
    } while (iVar3 == iVar2);
    fclose(pFVar6);
  }
LAB_00106e2b:
  sVar4 = strlen(path);
  if ((((2 < sVar4) && (iVar2 = strcmp(path + (sVar4 - 3),".7z"), path != (char *)0x0)) &&
      (iVar2 == 0)) &&
     (((iVar2 = stat(path,&sStack_a8), iVar2 == 0 && (iVar2 = access(path,4), iVar2 == 0)) &&
      (pFVar6 = fopen(path,"r"), pFVar6 != (FILE *)0x0)))) {
    piVar7 = &sig7z;
    do {
      if (*piVar7 == -1) {
        fclose(pFVar6);
        pFVar5 = open_pipe("7z x -so %s 2>/dev/null",path,"r");
        if (pFVar5 != (FILE *)0x0) {
          return pFVar5;
        }
        goto LAB_00106e7a;
      }
      iVar3 = getc(pFVar6);
      iVar2 = *piVar7;
      piVar7 = piVar7 + 1;
    } while (iVar3 == iVar2);
    fclose(pFVar6);
  }
LAB_00106e7a:
  bVar1 = has_suffix(path,".xz");
  if ((bVar1) && (pFVar5 = read_pipe("xz -c -d %s",(int *)xzsig,path), pFVar5 != (FILE *)0x0)) {
    return pFVar5;
  }
  pFVar6 = fopen(path,"r");
  return (FILE *)pFVar6;
}

Assistant:

inline FILE *open_to_read_file(const char *path)
{
    FILE *file = NULL;
#define READ_PIPE(SUFFIX, CMD, SIG)                                                                                    \
    do {                                                                                                               \
        if (has_suffix(path, SUFFIX)) {                                                                                \
            file = read_pipe(CMD, SIG, path);                                                                          \
        }                                                                                                              \
    } while (0)

    READ_PIPE(".bz2", "bzip2 -c -d %s", bz2sig);
    if (file) return file;
    READ_PIPE(".gz", "gzip -c -d %s", gzsig);
    if (file) return file;
    READ_PIPE(".lzma", "lzma -c -d %s", lzmasig);
    if (file) return file;
    READ_PIPE(".7z", "7z x -so %s 2>/dev/null", sig7z);
    if (file) return file;
    READ_PIPE(".xz", "xz -c -d %s", xzsig);
    if (file) return file;

    file = fopen(path, "r");
    return file;
}